

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlNodePtr
xmlCtxtParseContent(xmlParserCtxtPtr ctxt,xmlParserInputPtr input,xmlNodePtr node,int hasTextDecl)

{
  byte *pbVar1;
  xmlElementType xVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  _xmlDoc *p_Var6;
  xmlDictPtr pxVar7;
  int iVar8;
  xmlNodePtr pxVar9;
  xmlNs *saxData;
  int nr;
  xmlHashedString xVar10;
  xmlHashedString local_50;
  xmlHashedString local_40;
  
  if ((((input == (xmlParserInputPtr)0x0 || ctxt == (xmlParserCtxtPtr)0x0) ||
        node == (xmlNodePtr)0x0) || (p_Var6 = node->doc, p_Var6 == (_xmlDoc *)0x0)) ||
     (xVar2 = node->type, XML_HTML_DOCUMENT_NODE < xVar2)) {
LAB_0013d00d:
    pxVar9 = (xmlNodePtr)0x0;
    xmlFatalErr(ctxt,XML_ERR_ARGUMENT,(char *)0x0);
  }
  else {
    if ((0x1bcU >> (xVar2 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
      if ((0x2202U >> (xVar2 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) goto LAB_0013d00d;
    }
    else {
      pxVar9 = node->parent;
      if ((pxVar9 != (xmlNodePtr)0x0) &&
         ((XML_HTML_DOCUMENT_NODE < pxVar9->type ||
          (node = pxVar9,
          (0x2202U >> (pxVar9->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)))) {
        do {
        } while( true );
      }
    }
    if (ctxt->html == 0) {
      xmlCtxtReset(ctxt);
    }
    else {
      htmlCtxtReset(ctxt);
    }
    pxVar7 = ctxt->dict;
    uVar3 = ctxt->options;
    iVar4 = ctxt->dictNames;
    uVar5 = ctxt->loadsubset;
    if (p_Var6->dict == (_xmlDict *)0x0) {
      ctxt->options = uVar3 | 0x1000;
      ctxt->dictNames = 0;
    }
    else {
      ctxt->dict = p_Var6->dict;
    }
    ctxt->loadsubset = uVar5 | 8;
    ctxt->myDoc = p_Var6;
    if (ctxt->html == 0) {
      xmlCtxtInitializeLate(ctxt);
      nr = 0;
      if (node != (xmlNodePtr)0x0) {
        do {
          if (node->type != XML_ELEMENT_NODE) break;
          for (saxData = node->nsDef; saxData != (xmlNs *)0x0; saxData = saxData->next) {
            xVar10 = xmlDictLookupHashed(ctxt->dict,saxData->prefix,-1);
            local_40.name = xVar10.name;
            local_40.hashValue = xVar10.hashValue;
            xVar10 = xmlDictLookupHashed(ctxt->dict,saxData->href,-1);
            local_50.name = xVar10.name;
            local_50.hashValue = xVar10.hashValue;
            iVar8 = xmlParserNsPush(ctxt,&local_40,&local_50,saxData,1);
            nr = nr + (uint)(0 < iVar8);
          }
          node = node->parent;
        } while (node != (_xmlNode *)0x0);
      }
      pxVar9 = xmlCtxtParseContentInternal(ctxt,input,hasTextDecl,1);
      if (0 < nr) {
        xmlParserNsPop(ctxt,nr);
      }
    }
    else {
      pbVar1 = (byte *)((long)&ctxt->options + 1);
      *pbVar1 = *pbVar1 | 0x20;
      pxVar9 = htmlCtxtParseContentInternal(ctxt,input);
    }
    ctxt->dict = pxVar7;
    ctxt->options = uVar3;
    ctxt->dictNames = iVar4;
    ctxt->loadsubset = uVar5;
    ctxt->myDoc = (xmlDocPtr)0x0;
    ctxt->node = (xmlNodePtr)0x0;
  }
  xmlFreeInputStream(input);
  return pxVar9;
}

Assistant:

xmlNodePtr
xmlCtxtParseContent(xmlParserCtxtPtr ctxt, xmlParserInputPtr input,
                    xmlNodePtr node, int hasTextDecl) {
    xmlDocPtr doc;
    xmlNodePtr cur, list = NULL;
    int nsnr = 0;
    xmlDictPtr oldDict;
    int oldOptions, oldDictNames, oldLoadSubset;

    if ((ctxt == NULL) || (input == NULL) || (node == NULL)) {
        xmlFatalErr(ctxt, XML_ERR_ARGUMENT, NULL);
        goto exit;
    }

    doc = node->doc;
    if (doc == NULL) {
        xmlFatalErr(ctxt, XML_ERR_ARGUMENT, NULL);
        goto exit;
    }

    switch (node->type) {
        case XML_ELEMENT_NODE:
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
            break;

        case XML_ATTRIBUTE_NODE:
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
            for (cur = node->parent; cur != NULL; cur = node->parent) {
                if ((cur->type == XML_ELEMENT_NODE) ||
                    (cur->type == XML_DOCUMENT_NODE) ||
                    (cur->type == XML_HTML_DOCUMENT_NODE)) {
                    node = cur;
                    break;
                }
            }
            break;

        default:
            xmlFatalErr(ctxt, XML_ERR_ARGUMENT, NULL);
            goto exit;
    }

#ifdef LIBXML_HTML_ENABLED
    if (ctxt->html)
        htmlCtxtReset(ctxt);
    else
#endif
        xmlCtxtReset(ctxt);

    oldDict = ctxt->dict;
    oldOptions = ctxt->options;
    oldDictNames = ctxt->dictNames;
    oldLoadSubset = ctxt->loadsubset;

    /*
     * Use input doc's dict if present, else assure XML_PARSE_NODICT is set.
     */
    if (doc->dict != NULL) {
        ctxt->dict = doc->dict;
    } else {
        ctxt->options |= XML_PARSE_NODICT;
        ctxt->dictNames = 0;
    }

    /*
     * Disable IDs
     */
    ctxt->loadsubset |= XML_SKIP_IDS;

    ctxt->myDoc = doc;

#ifdef LIBXML_HTML_ENABLED
    if (ctxt->html) {
        /*
         * When parsing in context, it makes no sense to add implied
         * elements like html/body/etc...
         */
        ctxt->options |= HTML_PARSE_NOIMPLIED;

        list = htmlCtxtParseContentInternal(ctxt, input);
    } else
#endif
    {
        xmlCtxtInitializeLate(ctxt);

        /*
         * initialize the SAX2 namespaces stack
         */
        cur = node;
        while ((cur != NULL) && (cur->type == XML_ELEMENT_NODE)) {
            xmlNsPtr ns = cur->nsDef;
            xmlHashedString hprefix, huri;

            while (ns != NULL) {
                hprefix = xmlDictLookupHashed(ctxt->dict, ns->prefix, -1);
                huri = xmlDictLookupHashed(ctxt->dict, ns->href, -1);
                if (xmlParserNsPush(ctxt, &hprefix, &huri, ns, 1) > 0)
                    nsnr++;
                ns = ns->next;
            }
            cur = cur->parent;
        }

        list = xmlCtxtParseContentInternal(ctxt, input, hasTextDecl, 1);

        if (nsnr > 0)
            xmlParserNsPop(ctxt, nsnr);
    }

    ctxt->dict = oldDict;
    ctxt->options = oldOptions;
    ctxt->dictNames = oldDictNames;
    ctxt->loadsubset = oldLoadSubset;
    ctxt->myDoc = NULL;
    ctxt->node = NULL;

exit:
    xmlFreeInputStream(input);
    return(list);
}